

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib573.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  char *__format;
  timeval tVar5;
  int running;
  int maxfd;
  double connect_time;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1ec;
  long local_1e8;
  int local_1dc;
  double local_1d8;
  double local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1ec = 1;
  local_1d0 = 0.0;
  local_1d8 = 1.0;
  do {
    local_1d8 = local_1d8 * 0.5;
  } while (1.0 < local_1d8 * 0.5 + 1.0);
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    test_cold_1();
    goto LAB_00102a9e;
  }
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    test_cold_15();
    iVar1 = 0x7c;
LAB_001029e6:
    lVar3 = 0;
  }
  else {
    iVar1 = curl_easy_setopt(lVar2,0x2a,1);
    if (iVar1 != 0) {
      test_cold_2();
      goto LAB_001029e6;
    }
    iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
    if (iVar1 != 0) {
      test_cold_3();
      goto LAB_001029e6;
    }
    libtest_debug_config.tracetime = 1;
    libtest_debug_config.nohex = 1;
    iVar1 = curl_easy_setopt(lVar2,0x276f);
    if (iVar1 != 0) {
      test_cold_4();
      goto LAB_001029e6;
    }
    iVar1 = curl_easy_setopt(lVar2,0x4e7e,libtest_debug_cb);
    if (iVar1 != 0) {
      test_cold_5();
      goto LAB_001029e6;
    }
    iVar1 = curl_easy_setopt(lVar2,0x29,1);
    if (iVar1 != 0) {
      test_cold_6();
      goto LAB_001029e6;
    }
    lVar3 = curl_multi_init();
    if (lVar3 == 0) {
      test_cold_14();
      iVar1 = 0x7b;
      goto LAB_001029e6;
    }
    iVar1 = curl_multi_add_handle(lVar3,lVar2);
    if (iVar1 == 0) {
      local_1e8 = lVar2;
      do {
        local_1dc = -99;
        local_1c8.tv_sec = 0;
        local_1c8.tv_usec = 100000;
        iVar1 = curl_multi_perform(lVar3,&local_1ec);
        if (iVar1 != 0) {
          test_cold_8();
          lVar2 = local_1e8;
          goto LAB_00102a7e;
        }
        if (local_1ec < 0) {
          __format = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uVar4 = 0x4c;
LAB_00102a55:
          fprintf(_stderr,__format,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                  ,uVar4);
          iVar1 = 0x7a;
          lVar2 = local_1e8;
          goto LAB_00102a7e;
        }
        tVar5 = tutil_tvnow();
        lVar2 = tutil_tvdiff(tVar5,tv_test_start);
        if (60000 < lVar2) {
          test_cold_9();
LAB_00102a74:
          iVar1 = 0x7d;
          lVar2 = local_1e8;
          goto LAB_00102a7e;
        }
        if (local_1ec == 0) break;
        local_b8.__fds_bits[0xe] = 0;
        local_b8.__fds_bits[0xf] = 0;
        local_b8.__fds_bits[0xc] = 0;
        local_b8.__fds_bits[0xd] = 0;
        local_b8.__fds_bits[10] = 0;
        local_b8.__fds_bits[0xb] = 0;
        local_b8.__fds_bits[8] = 0;
        local_b8.__fds_bits[9] = 0;
        local_b8.__fds_bits[6] = 0;
        local_b8.__fds_bits[7] = 0;
        local_b8.__fds_bits[4] = 0;
        local_b8.__fds_bits[5] = 0;
        local_b8.__fds_bits[2] = 0;
        local_b8.__fds_bits[3] = 0;
        local_b8.__fds_bits[0] = 0;
        local_b8.__fds_bits[1] = 0;
        local_138.__fds_bits[0] = 0;
        local_138.__fds_bits[1] = 0;
        local_138.__fds_bits[2] = 0;
        local_138.__fds_bits[3] = 0;
        local_138.__fds_bits[4] = 0;
        local_138.__fds_bits[5] = 0;
        local_138.__fds_bits[6] = 0;
        local_138.__fds_bits[7] = 0;
        local_138.__fds_bits[8] = 0;
        local_138.__fds_bits[9] = 0;
        local_138.__fds_bits[10] = 0;
        local_138.__fds_bits[0xb] = 0;
        local_138.__fds_bits[0xc] = 0;
        local_138.__fds_bits[0xd] = 0;
        local_138.__fds_bits[0xe] = 0;
        local_138.__fds_bits[0xf] = 0;
        local_1b8.__fds_bits[0] = 0;
        local_1b8.__fds_bits[1] = 0;
        local_1b8.__fds_bits[2] = 0;
        local_1b8.__fds_bits[3] = 0;
        local_1b8.__fds_bits[4] = 0;
        local_1b8.__fds_bits[5] = 0;
        local_1b8.__fds_bits[6] = 0;
        local_1b8.__fds_bits[7] = 0;
        local_1b8.__fds_bits[8] = 0;
        local_1b8.__fds_bits[9] = 0;
        local_1b8.__fds_bits[10] = 0;
        local_1b8.__fds_bits[0xb] = 0;
        local_1b8.__fds_bits[0xc] = 0;
        local_1b8.__fds_bits[0xd] = 0;
        local_1b8.__fds_bits[0xe] = 0;
        local_1b8.__fds_bits[0xf] = 0;
        iVar1 = curl_multi_fdset(lVar3,&local_b8,&local_138,&local_1b8,&local_1dc);
        if (iVar1 != 0) {
          test_cold_10();
          lVar2 = local_1e8;
          goto LAB_00102a7e;
        }
        if (local_1dc < -1) {
          __format = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uVar4 = 0x57;
          goto LAB_00102a55;
        }
        iVar1 = select_wrapper(local_1dc + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
        if (iVar1 == -1) {
          test_cold_12();
          iVar1 = 0x79;
          lVar2 = local_1e8;
          goto LAB_00102a7e;
        }
        tVar5 = tutil_tvnow();
        lVar2 = tutil_tvdiff(tVar5,tv_test_start);
        if (60000 < lVar2) {
          test_cold_11();
          goto LAB_00102a74;
        }
      } while (local_1ec != 0);
      lVar2 = local_1e8;
      iVar1 = 0;
      curl_easy_getinfo(local_1e8,0x300005,&local_1d0);
      if (local_1d0 < local_1d8) {
        test_cold_13();
        iVar1 = 0x7e;
      }
    }
    else {
      test_cold_7();
    }
  }
LAB_00102a7e:
  curl_multi_remove_handle(lVar3,lVar2);
  curl_multi_cleanup(lVar3);
  curl_easy_cleanup(lVar2);
  curl_global_cleanup();
LAB_00102a9e:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running = 1;
  double connect_time = 0.0;
  double dbl_epsilon;

  dbl_epsilon = 1.0;
  do {
    dbl_epsilon /= 2.0;
  } while ((double)(1.0 + (dbl_epsilon/2.0)) > (double)1.0);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_URL, URL);

  libtest_debug_config.nohex = 1;
  libtest_debug_config.tracetime = 1;
  easy_setopt(c, CURLOPT_DEBUGDATA, &libtest_debug_config);
  easy_setopt(c, CURLOPT_DEBUGFUNCTION, libtest_debug_cb);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  while (running) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

  curl_easy_getinfo(c, CURLINFO_CONNECT_TIME, &connect_time);
  if (connect_time < dbl_epsilon) {
    fprintf(stderr, "connect time is < epsilon\n");
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}